

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O2

int CVmObjByteArray::call_stat_prop(vm_val_t *result,uchar **pc_ptr,uint *argc,vm_prop_id_t prop)

{
  int iVar1;
  
  iVar1 = CVmMetaTable::prop_to_vector_idx(G_meta_table_X,metaclass_reg_->meta_reg_idx_,prop);
  if (iVar1 == 8) {
    static_packBytes(result,argc);
    return 1;
  }
  iVar1 = CVmObject::call_stat_prop(result,pc_ptr,argc,prop);
  return iVar1;
}

Assistant:

int CVmObjByteArray::call_stat_prop(VMG_ vm_val_t *result,
                                    const uchar **pc_ptr, uint *argc,
                                    vm_prop_id_t prop)
{
    /* get the function table index */
    int idx = G_meta_table->prop_to_vector_idx(
        metaclass_reg_->get_reg_idx(), prop);

    /* check for static methods we define in ByteArray */
    switch (idx)
    {
    case PROPIDX_packBytes:
        /* the static version of packBytes() */
        return static_packBytes(vmg_ result, argc);

    default:
        /* not one of ours - defer to the superclass */
        return CVmObject::call_stat_prop(vmg_ result, pc_ptr, argc, prop);
    }
}